

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

void rw::hAnimFrameRead(Stream *stream,Animation *anim)

{
  void *pvVar1;
  int32 iVar2;
  float32 fVar3;
  int local_24;
  int32 prev;
  int32 i;
  HAnimKeyFrame *frames;
  Animation *anim_local;
  Stream *stream_local;
  
  pvVar1 = anim->keyframes;
  for (local_24 = 0; local_24 < anim->numFrames; local_24 = local_24 + 1) {
    fVar3 = Stream::readF32(stream);
    *(float32 *)((long)pvVar1 + (long)local_24 * 0x28 + 8) = fVar3;
    Stream::read32(stream,(void *)((long)pvVar1 + (long)local_24 * 0x28 + 0xc),0x10);
    Stream::read32(stream,(void *)((long)pvVar1 + (long)local_24 * 0x28 + 0x1c),0xc);
    iVar2 = Stream::readI32(stream);
    *(void **)((long)pvVar1 + (long)local_24 * 0x28) =
         (void *)((long)pvVar1 + (long)(iVar2 / 0x24) * 0x28);
  }
  return;
}

Assistant:

static void
hAnimFrameRead(Stream *stream, Animation *anim)
{
	HAnimKeyFrame *frames = (HAnimKeyFrame*)anim->keyframes;
	for(int32 i = 0; i < anim->numFrames; i++){
		frames[i].time = stream->readF32();
		stream->read32(&frames[i].q, 4*4);
		stream->read32(&frames[i].t, 3*4);
		int32 prev = stream->readI32()/0x24;
		frames[i].prev = &frames[prev];
	}
}